

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib564.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int maxfd;
  int running;
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1d8;
  int local_1d4;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                  ,0x29,iVar2,uVar4);
  }
  if (iVar2 != 0) goto LAB_001023e8;
  lVar5 = curl_easy_init();
  iVar2 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                  ,0x2b);
    iVar2 = 0x7c;
  }
  if (lVar5 == 0) {
LAB_001023d0:
    lVar6 = 0;
  }
  else {
    iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                    ,0x2d,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      iVar3 = curl_easy_setopt(lVar5,0x29,1);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                      ,0x2e,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_001023d0;
      iVar3 = curl_easy_setopt(lVar5,0x2714,libtest_arg2);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                      ,0x2f,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_0010236e;
      iVar3 = curl_easy_setopt(lVar5,0x65,4);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                      ,0x30,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_001023d0;
      lVar6 = curl_multi_init();
      if (lVar6 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                      ,0x32);
        iVar2 = 0x7b;
      }
      else {
        iVar2 = curl_multi_add_handle(lVar6,lVar5);
        uVar1 = _stderr;
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          uVar4 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                        ,0x34,iVar2,uVar4);
        }
        if (iVar2 == 0) {
          curl_mfprintf(_stderr,"Start at URL 0\n");
          iVar2 = 0;
          do {
            local_1d8 = -99;
            local_1c8.tv_sec = 1;
            local_1c8.tv_usec = 0;
            iVar3 = curl_multi_perform(lVar6,&local_1d4);
            uVar1 = _stderr;
            if (iVar3 == 0) {
              if (local_1d4 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                              ,0x40);
                iVar2 = 0x7a;
              }
            }
            else {
              uVar4 = curl_multi_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                            ,0x40,iVar3,uVar4);
              iVar2 = iVar3;
            }
            iVar3 = 0xc;
            if (iVar2 == 0) {
              tVar10 = tutil_tvnow();
              lVar7 = tutil_tvdiff(tVar10,tv_test_start);
              if (lVar7 < 0xea61) {
                if (local_1d4 == 0) {
                  iVar2 = 0;
                  iVar3 = 0x25;
                }
                else {
                  local_b8.__fds_bits[0xe] = 0;
                  local_b8.__fds_bits[0xf] = 0;
                  local_b8.__fds_bits[0xc] = 0;
                  local_b8.__fds_bits[0xd] = 0;
                  local_b8.__fds_bits[10] = 0;
                  local_b8.__fds_bits[0xb] = 0;
                  local_b8.__fds_bits[8] = 0;
                  local_b8.__fds_bits[9] = 0;
                  local_b8.__fds_bits[6] = 0;
                  local_b8.__fds_bits[7] = 0;
                  local_b8.__fds_bits[4] = 0;
                  local_b8.__fds_bits[5] = 0;
                  local_b8.__fds_bits[2] = 0;
                  local_b8.__fds_bits[3] = 0;
                  local_b8.__fds_bits[0] = 0;
                  local_b8.__fds_bits[1] = 0;
                  local_138.__fds_bits[0] = 0;
                  local_138.__fds_bits[1] = 0;
                  local_138.__fds_bits[2] = 0;
                  local_138.__fds_bits[3] = 0;
                  local_138.__fds_bits[4] = 0;
                  local_138.__fds_bits[5] = 0;
                  local_138.__fds_bits[6] = 0;
                  local_138.__fds_bits[7] = 0;
                  local_138.__fds_bits[8] = 0;
                  local_138.__fds_bits[9] = 0;
                  local_138.__fds_bits[10] = 0;
                  local_138.__fds_bits[0xb] = 0;
                  local_138.__fds_bits[0xc] = 0;
                  local_138.__fds_bits[0xd] = 0;
                  local_138.__fds_bits[0xe] = 0;
                  local_138.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  iVar2 = curl_multi_fdset(lVar6,&local_b8,&local_138,&local_1b8,&local_1d8);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    iVar2 = 0;
                    if (local_1d8 < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                                    ,0x4b);
                      iVar2 = 0x7a;
                    }
                  }
                  else {
                    uVar4 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                                  ,0x4b,iVar2,uVar4);
                  }
                  if (iVar2 == 0) {
                    iVar2 = select_wrapper(local_1d8 + 1,&local_b8,&local_138,&local_1b8,&local_1c8)
                    ;
                    if (iVar2 == -1) {
                      piVar8 = __errno_location();
                      iVar2 = *piVar8;
                      local_1d0 = _stderr;
                      pcVar9 = strerror(iVar2);
                      curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                                    ,0x4f,iVar2,pcVar9);
                      iVar2 = 0x79;
                    }
                    else {
                      tVar10 = tutil_tvnow();
                      lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                      iVar3 = 0;
                      iVar2 = 0;
                      if (60000 < lVar7) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                                      ,0x51);
                        iVar2 = 0x7d;
                        iVar3 = 0xc;
                      }
                    }
                  }
                }
              }
              else {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib564.c"
                              ,0x42);
                iVar2 = 0x7d;
              }
            }
          } while (iVar3 == 0);
          if ((iVar3 != 0x25) && (iVar3 != 0xc)) goto LAB_001023e8;
        }
      }
    }
    else {
LAB_0010236e:
      lVar6 = 0;
    }
  }
  curl_easy_cleanup(lVar5);
  curl_multi_cleanup(lVar6);
  curl_global_cleanup();
LAB_001023e8:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int running;
  CURLM *m = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  easy_setopt(curl, CURLOPT_PROXYTYPE, (long)CURLPROXY_SOCKS4);

  multi_init(m);

  multi_add_handle(m, curl);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}